

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O0

Txid * __thiscall
cfd::core::MerkleBlock::CalculateHash
          (Txid *__return_storage_ptr__,MerkleBlock *this,uint64_t height,uint64_t pos,
          vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *txids)

{
  const_reference object;
  uint64_t uVar1;
  ByteData256 local_100;
  ByteData local_e8;
  ByteData local_d0;
  undefined1 local_b8 [8];
  ByteData data;
  undefined1 local_70 [8];
  Txid right;
  Txid left;
  vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *txids_local;
  uint64_t pos_local;
  uint64_t height_local;
  MerkleBlock *this_local;
  
  if (height == 0) {
    object = ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::operator[](txids,pos)
    ;
    Txid::Txid(__return_storage_ptr__,object);
  }
  else {
    CalculateHash((Txid *)&right.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,this,height - 1,pos * 2,txids)
    ;
    Txid::Txid((Txid *)local_70);
    uVar1 = CalcTreeWidth(this->transaction_count,height - 1);
    if (pos * 2 + 1 < uVar1) {
      CalculateHash((Txid *)&data.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,this,height - 1,
                    pos * 2 + 1,txids);
      Txid::operator=((Txid *)local_70,
                      (Txid *)&data.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
      Txid::~Txid((Txid *)&data.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
    }
    else {
      Txid::operator=((Txid *)local_70,
                      (Txid *)&right.data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    Txid::GetData(&local_d0,
                  (Txid *)&right.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
    Txid::GetData(&local_e8,(Txid *)local_70);
    ByteData::Concat<cfd::core::ByteData>((ByteData *)local_b8,&local_d0,&local_e8);
    ByteData::~ByteData(&local_e8);
    ByteData::~ByteData(&local_d0);
    HashUtil::Sha256D(&local_100,(ByteData *)local_b8);
    Txid::Txid(__return_storage_ptr__,&local_100);
    ByteData256::~ByteData256(&local_100);
    ByteData::~ByteData((ByteData *)local_b8);
    Txid::~Txid((Txid *)local_70);
    Txid::~Txid((Txid *)&right.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  }
  return __return_storage_ptr__;
}

Assistant:

Txid MerkleBlock::CalculateHash(
    uint64_t height, uint64_t pos, const std::vector<Txid>& txids) {
  if (height == 0) return txids[pos];

  Txid left = CalculateHash(height - 1, pos * 2, txids);
  Txid right;
  if ((pos * 2 + 1) < CalcTreeWidth(transaction_count, height - 1)) {
    right = CalculateHash(height - 1, pos * 2 + 1, txids);
  } else {
    right = left;
  }
  ByteData data = left.GetData().Concat(right.GetData());
  return Txid(HashUtil::Sha256D(data));
}